

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O0

void __thiscall FxConstant::FxConstant(FxConstant *this,int val,FScriptPosition *pos)

{
  PInt *pPVar1;
  FScriptPosition *pos_local;
  int val_local;
  FxConstant *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00a0ba60;
  ExpVal::ExpVal(&this->value);
  pPVar1 = TypeSInt32;
  (this->value).Type = (PType *)TypeSInt32;
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  (this->value).field_1.Int = val;
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(int val, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = TypeSInt32;
		value.Int = val;
		isresolved = true;
	}